

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::GetSubstitutionRange(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  size_type in_R9;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  functional_internal *local_38;
  code *local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  code *local_10;
  
  local_38 = this + 0x10;
  local_30 = str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_28 = *(undefined8 *)this;
  local_20 = str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  local_18 = *(undefined8 *)(this + 8);
  local_10 = str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
  format.size_ = (size_t)&local_38;
  format.data_ = (void *)0x3d;
  args.len_ = in_R9;
  args.ptr_ = (pointer)0x3;
  str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,
             (str_format_internal *)"variable used for annotation used multiple times: %s (%d..%d)",
             format,args);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}